

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

bool __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::canInsert
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,
          gate_type *gate)

{
  int iVar1;
  int iVar2;
  const_iterator __first;
  const_iterator __last;
  reference piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> qubits;
  gate_type *gate_local;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this_local;
  
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)gate;
  (*gate->_vptr_QObject[5])();
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_38);
  __last = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_38);
  local_40 = std::
             max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       (__first._M_current,__last._M_current);
  piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_40);
  iVar2 = *piVar3;
  iVar1 = this->nbQubits_;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return iVar2 < iVar1;
}

Assistant:

bool canInsert( const gate_type& gate ) const {
        const auto qubits = gate.qubits() ;
        if ( *std::max_element( qubits.begin() , qubits.end() ) >= nbQubits_ ) {
          return false ;
        }
        return true ;
      }